

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_cnv.cpp
# Opt level: O3

void ucnv_fromUWriteBytes_63
               (UConverter *cnv,char *bytes,int32_t length,char **target,char *targetLimit,
               int32_t **offsets,int32_t sourceIndex,UErrorCode *pErrorCode)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  int32_t *piVar5;
  
  pcVar2 = *target;
  if ((offsets == (int32_t **)0x0) || (piVar5 = *offsets, piVar5 == (int32_t *)0x0)) {
    uVar4 = length;
    if (pcVar2 < targetLimit && 0 < length) {
      do {
        cVar1 = *bytes;
        bytes = bytes + 1;
        *pcVar2 = cVar1;
        pcVar2 = pcVar2 + 1;
        length = uVar4 - 1;
        if (uVar4 < 2) break;
        uVar4 = length;
      } while (pcVar2 < targetLimit);
    }
  }
  else {
    uVar4 = length;
    if (pcVar2 < targetLimit && 0 < length) {
      do {
        cVar1 = *bytes;
        bytes = bytes + 1;
        *pcVar2 = cVar1;
        pcVar2 = pcVar2 + 1;
        *piVar5 = sourceIndex;
        piVar5 = piVar5 + 1;
        uVar4 = length - 1;
        if ((uint)length < 2) break;
        length = uVar4;
      } while (pcVar2 < targetLimit);
    }
    *offsets = piVar5;
    length = uVar4;
  }
  *target = pcVar2;
  if (0 < length) {
    if (cnv != (UConverter *)0x0) {
      cnv->charErrorBufferLength = (int8_t)length;
      uVar4 = length + 1;
      lVar3 = 0;
      do {
        cnv->charErrorBuffer[lVar3] = bytes[lVar3];
        uVar4 = uVar4 - 1;
        lVar3 = lVar3 + 1;
      } while (1 < uVar4);
    }
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_fromUWriteBytes(UConverter *cnv,
                     const char *bytes, int32_t length,
                     char **target, const char *targetLimit,
                     int32_t **offsets,
                     int32_t sourceIndex,
                     UErrorCode *pErrorCode) {
    char *t=*target;
    int32_t *o;

    /* write bytes */
    if(offsets==NULL || (o=*offsets)==NULL) {
        while(length>0 && t<targetLimit) {
            *t++=*bytes++;
            --length;
        }
    } else {
        /* output with offsets */
        while(length>0 && t<targetLimit) {
            *t++=*bytes++;
            *o++=sourceIndex;
            --length;
        }
        *offsets=o;
    }
    *target=t;

    /* write overflow */
    if(length>0) {
        if(cnv!=NULL) {
            t=(char *)cnv->charErrorBuffer;
            cnv->charErrorBufferLength=(int8_t)length;
            do {
                *t++=(uint8_t)*bytes++;
            } while(--length>0);
        }
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
}